

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

int __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::get_codepoint(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this)

{
  uint uVar1;
  int iVar2;
  const_iterator puVar3;
  byte bVar4;
  bool local_69;
  uint factor;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<unsigned_int> *__range3;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 local_30 [8];
  initializer_list<unsigned_int> factors;
  int codepoint;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  if (this->current != 0x75) {
    __assert_fail("current == \'u\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/nlohmann/include/nlohmann/detail/input/lexer.hpp"
                  ,0xa4,
                  "int nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::get_codepoint() [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>]"
                 );
  }
  factors._M_len._4_4_ = 0;
  __range3._0_4_ = 0xc;
  __range3._4_4_ = 8;
  local_38 = 4;
  local_34 = 0;
  local_30 = (undefined1  [8])&__range3;
  factors._M_array = (iterator)0x4;
  __end3 = std::initializer_list<unsigned_int>::begin((initializer_list<unsigned_int> *)local_30);
  puVar3 = std::initializer_list<unsigned_int>::end((initializer_list<unsigned_int> *)local_30);
  do {
    if (__end3 == puVar3) {
      local_69 = factors._M_len._4_4_ < 0x10000;
      if (local_69) {
        return factors._M_len._4_4_;
      }
      __assert_fail("0x0000 <= codepoint && codepoint <= 0xFFFF",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/nlohmann/include/nlohmann/detail/input/lexer.hpp"
                    ,0xbe,
                    "int nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::get_codepoint() [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>]"
                   );
    }
    uVar1 = *__end3;
    get(this);
    bVar4 = (byte)uVar1;
    if ((this->current < 0x30) || (0x39 < this->current)) {
      if ((this->current < 0x41) || (0x46 < this->current)) {
        if ((this->current < 0x61) || (0x66 < this->current)) {
          return -1;
        }
        iVar2 = this->current + -0x57 << (bVar4 & 0x1f);
      }
      else {
        iVar2 = this->current + -0x37 << (bVar4 & 0x1f);
      }
    }
    else {
      iVar2 = this->current + -0x30 << (bVar4 & 0x1f);
    }
    factors._M_len._4_4_ = iVar2 + factors._M_len._4_4_;
    __end3 = __end3 + 1;
  } while( true );
}

Assistant:

int get_codepoint()
    {
        // this function only makes sense after reading `\u`
        JSON_ASSERT(current == 'u');
        int codepoint = 0;

        const auto factors = { 12u, 8u, 4u, 0u };
        for (const auto factor : factors)
        {
            get();

            if (current >= '0' && current <= '9')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x30u) << factor);
            }
            else if (current >= 'A' && current <= 'F')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x37u) << factor);
            }
            else if (current >= 'a' && current <= 'f')
            {
                codepoint += static_cast<int>((static_cast<unsigned int>(current) - 0x57u) << factor);
            }
            else
            {
                return -1;
            }
        }

        JSON_ASSERT(0x0000 <= codepoint && codepoint <= 0xFFFF);
        return codepoint;
    }